

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

Yshort ** transpose(Yshort **R,int n)

{
  int iVar1;
  int *piVar2;
  char *__ptr;
  Yshort **ppYVar3;
  char *__ptr_00;
  Yshort *pYVar4;
  int local_3c;
  int k;
  int i;
  Yshort *sp;
  Yshort *nedges;
  Yshort **temp_R;
  Yshort **new_R;
  int n_local;
  Yshort **R_local;
  
  __ptr = allocate(n << 2);
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    _k = R[local_3c];
    if (_k != (int *)0x0) {
      while (-1 < *_k) {
        *(int *)(__ptr + (long)*_k * 4) = *(int *)(__ptr + (long)*_k * 4) + 1;
        _k = _k + 1;
      }
    }
  }
  ppYVar3 = (Yshort **)allocate(n << 3);
  __ptr_00 = allocate(n << 3);
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    iVar1 = *(int *)(__ptr + (long)local_3c * 4);
    if (0 < iVar1) {
      pYVar4 = (Yshort *)allocate((iVar1 + 1) * 4);
      ppYVar3[local_3c] = pYVar4;
      *(Yshort **)(__ptr_00 + (long)local_3c * 8) = pYVar4;
      pYVar4[iVar1] = -1;
    }
  }
  free(__ptr);
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    _k = R[local_3c];
    if (_k != (int *)0x0) {
      while (-1 < *_k) {
        piVar2 = *(int **)(__ptr_00 + (long)*_k * 8);
        *(int **)(__ptr_00 + (long)*_k * 8) = piVar2 + 1;
        *piVar2 = local_3c;
        _k = _k + 1;
      }
    }
  }
  free(__ptr_00);
  return ppYVar3;
}

Assistant:

Yshort **transpose(Yshort **R, int n)
{
  register Yshort **new_R;
  register Yshort **temp_R;
  register Yshort *nedges;
  register Yshort *sp;
  register int i;
  register int k;

  nedges = NEW2(n, Yshort);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    nedges[*sp++]++;
	}
    }

  new_R = NEW2(n, Yshort *);
  temp_R = NEW2(n, Yshort *);

  for (i = 0; i < n; i++)
    {
      k = nedges[i];
      if (k > 0)
	{
	  sp = NEW2(k + 1, Yshort);
	  new_R[i] = sp;
	  temp_R[i] = sp;
	  sp[k] = -1;
	}
    }

  FREE(nedges);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    *temp_R[*sp++]++ = i;
	}
    }

  FREE(temp_R);

  return (new_R);
}